

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::ArrowTableFunction::ArrowToDuckDB
               (ArrowScanLocalState *scan_state,arrow_column_map_t *arrow_convert_data,
               DataChunk *output,idx_t start,bool arrow_scan_is_projected,idx_t rowid_column_index)

{
  ArrowArray *array;
  long lVar1;
  int64_t parent_offset;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *this;
  bool bVar2;
  reference pvVar3;
  value_type vVar4;
  ArrowArrayWrapper *pAVar5;
  ArrowArrayWrapper *pAVar6;
  mapped_type *this_00;
  type this_01;
  ArrowArrayScanState *array_state;
  reference pvVar7;
  InvalidInputException *pIVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  undefined7 in_register_00000081;
  size_type __n;
  unsigned_long col_idx;
  uint64_t in_stack_ffffffffffffff40;
  ulong local_80;
  undefined4 local_74;
  idx_t local_70;
  vector<unsigned_long,_true> *local_68;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *local_60;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  string local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000081,arrow_scan_is_projected);
  if ((output->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (output->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68 = &scan_state->column_ids;
    local_60 = &scan_state->chunk;
    __n = 0;
    local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)arrow_convert_data;
    do {
      vVar4 = __n;
      if ((scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (scan_state->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pvVar3 = vector<unsigned_long,_true>::operator[](local_68,__n);
        vVar4 = *pvVar3;
      }
      this = local_60;
      uVar9 = vVar4;
      if ((char)local_74 != '\0') {
        uVar9 = __n;
      }
      local_80 = vVar4;
      if (rowid_column_index == 0xffffffffffffffff) {
        uVar10 = uVar9;
        if (vVar4 != 0xffffffffffffffff) goto LAB_00a63d4c;
      }
      else {
        uVar10 = rowid_column_index;
        if ((vVar4 != 0xffffffffffffffff) && (uVar10 = uVar9, rowid_column_index <= vVar4)) {
          local_80 = vVar4 + 1;
          uVar10 = uVar9 + 1;
        }
LAB_00a63d4c:
        pAVar5 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(local_60);
        pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this);
        array = (pAVar6->arrow_array).children[uVar10];
        if (array->release == (_func_void_ArrowArray_ptr *)0x0) {
          pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"arrow_scan: released array passed","");
          InvalidInputException::InvalidInputException(pIVar8,&local_50);
          __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        lVar1 = array->length;
        pAVar6 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(this);
        if (lVar1 != (pAVar6->arrow_array).length) {
          pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"arrow_scan: array length mismatch","");
          InvalidInputException::InvalidInputException(pIVar8,&local_50);
          __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_00 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ArrowType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at(local_58,&local_80);
        this_01 = shared_ptr<duckdb::ArrowType,_true>::operator*(this_00);
        array_state = ArrowScanLocalState::GetState(scan_state,local_80);
        if ((array_state->owned_data).internal.
            super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&array_state->owned_data,this);
        }
        bVar2 = ArrowType::HasDictionary(this_01);
        if (bVar2) {
          cVar11 = '\0';
        }
        else {
          bVar2 = ArrowType::RunEndEncoded(this_01);
          cVar11 = '\x02' - bVar2;
        }
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
        if (cVar11 == '\x02') {
          local_70 = output->count;
          parent_offset = (pAVar5->arrow_array).offset;
          FlatVector::VerifyFlatVector(pvVar7);
          GetValidityMask(&pvVar7->validity,array,scan_state,local_70,parent_offset,-1,false);
          pvVar7 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
          in_stack_ffffffffffffff40 = 0;
          ColumnArrowToDuckDB(pvVar7,array,array_state,output->count,this_01,-1,(ValidityMask *)0x0,
                              0,false);
        }
        else if (cVar11 == '\x01') {
          ColumnArrowToDuckDBRunEndEncoded
                    (pvVar7,array,array_state,output->count,this_01,-1,(ValidityMask *)0x0,
                     in_stack_ffffffffffffff40);
        }
        else {
          in_stack_ffffffffffffff40 = 0;
          ColumnArrowToDuckDBDictionary
                    (pvVar7,array,array_state,output->count,this_01,-1,(ValidityMask *)0x0,0);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(output->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(output->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void ArrowTableFunction::ArrowToDuckDB(ArrowScanLocalState &scan_state, const arrow_column_map_t &arrow_convert_data,
                                       DataChunk &output, idx_t start, bool arrow_scan_is_projected,
                                       idx_t rowid_column_index) {
	for (idx_t idx = 0; idx < output.ColumnCount(); idx++) {
		auto col_idx = scan_state.column_ids.empty() ? idx : scan_state.column_ids[idx];

		// If projection was not pushed down into the arrow scanner, but projection pushdown is enabled on the
		// table function, we need to use original column ids here.
		auto arrow_array_idx = arrow_scan_is_projected ? idx : col_idx;

		if (rowid_column_index != COLUMN_IDENTIFIER_ROW_ID) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				arrow_array_idx = rowid_column_index;
			} else if (col_idx >= rowid_column_index) {
				// Since the rowid column is skipped when the table is bound (its not a named column),
				// we need to shift references forward in the Arrow array by one to match the alignment
				// that DuckDB believes the Arrow array is in.
				col_idx += 1;
				arrow_array_idx += 1;
			}
		} else {
			// If there isn't any defined row_id_index, and we're asked for it, skip the column.
			// This is the incumbent behavior.
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				continue;
			}
		}

		auto &parent_array = scan_state.chunk->arrow_array;
		auto &array = *scan_state.chunk->arrow_array.children[arrow_array_idx];
		if (!array.release) {
			throw InvalidInputException("arrow_scan: released array passed");
		}
		if (array.length != scan_state.chunk->arrow_array.length) {
			throw InvalidInputException("arrow_scan: array length mismatch");
		}

		D_ASSERT(arrow_convert_data.find(col_idx) != arrow_convert_data.end());
		auto &arrow_type = *arrow_convert_data.at(col_idx);
		auto &array_state = scan_state.GetState(col_idx);

		// Make sure this Vector keeps the Arrow chunk alive in case we can zero-copy the data
		if (!array_state.owned_data) {
			array_state.owned_data = scan_state.chunk;
		}

		auto array_physical_type = GetArrowArrayPhysicalType(arrow_type);

		switch (array_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			SetValidityMask(output.data[idx], array, scan_state, output.size(), parent_array.offset, -1);
			ColumnArrowToDuckDB(output.data[idx], array, array_state, output.size(), arrow_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		}
	}
}